

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityMessages::testIgnored
          (TeamcityMessages *this,string *name,string *message,string *flowId)

{
  string *value;
  RaiiMessage msg;
  RaiiMessage local_80;
  string local_78 [32];
  string local_58;
  string local_38;
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_80,"testIgnored",this->m_out);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_80,"name",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_58,(string *)message);
  anon_unknown_1::RaiiMessage::writeProperty(&local_80,"message",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string(local_78,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_80,(char *)local_78,value);
  std::__cxx11::string::~string(local_78);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_80);
  return;
}

Assistant:

void TeamcityMessages::testIgnored(const std::string& name, const std::string& message, const std::string& flowId)
{
    RaiiMessage msg("testIgnored", *m_out);
    msg.writeProperty("name", name);
    msg.writeProperty("message", message);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}